

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Employee.cpp
# Opt level: O3

void __thiscall Employee::Employee(Employee *this,Employee *employee)

{
  int iVar1;
  int iVar2;
  int iVar3;
  bool bVar4;
  
  Person::Person(&this->super_Person,&employee->super_Person);
  (this->super_Person)._vptr_Person = (_func_int **)&PTR_validate_0010bd30;
  iVar1 = employee->salaryPerHour;
  iVar2 = employee->workToDo;
  iVar3 = employee->workDone;
  this->hourWork = employee->hourWork;
  this->salaryPerHour = iVar1;
  this->workToDo = iVar2;
  this->workDone = iVar3;
  if ((this->super_Person).id._M_dataplus._M_p[2] == '*') {
    bVar4 = Person::validate(&this->super_Person);
    if (bVar4) {
      return;
    }
  }
  std::operator<<((ostream *)&std::cout,"invalid id");
  exit(1);
}

Assistant:

Employee::Employee(const Employee &employee) : Person(employee) {
    hourWork = employee.hourWork;
    salaryPerHour = employee.salaryPerHour;
    workToDo = employee.workToDo;
    workDone = employee.workDone;
    if(!validate())
    {cout<<"invalid id";
        exit(1);
    }

}